

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator%=(uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uintwide_t<24U,_unsigned_char,_void,_false> remainder;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_38;
  
  if (this == (uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)other) {
    lVar2 = *(long *)(this + 0x10);
    uVar1 = *(uint *)(this + 8);
    for (lVar3 = 0; (ulong)uVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
      *(undefined4 *)(lVar2 + lVar3) = 0;
    }
  }
  else {
    local_38._vptr_dynamic_array = (_func_int **)0x0;
    local_38.elem_count = 0;
    local_38._12_4_ = 0;
    local_38.elems = (pointer)0x0;
    uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_38);
    eval_divide_knuth(this,other,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_38);
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator=
              ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this,
               &local_38);
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    ~dynamic_array(&local_38);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator%=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary modulus function.
        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          local_unsigned_wide_type remainder_unsigned { };

          a.eval_divide_knuth(b, &remainder_unsigned);

          // The sign of the remainder follows the sign of the denominator.
          if(numer_was_neg) { remainder_unsigned.negate(); }

          values = remainder_unsigned.values;
        }
        else
        {
          uintwide_t remainder { };

          eval_divide_knuth(other, &remainder);

          values = remainder.values;
        }
      }

      return *this;
    }